

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

void xmlCtxtVErr(xmlParserCtxtPtr ctxt,xmlNodePtr node,xmlErrorDomain domain,xmlParserErrors code,
                xmlErrorLevel level,xmlChar *str1,xmlChar *str2,xmlChar *str3,int int1,char *msg,
                __va_list_tag *ap)

{
  _xmlSAXHandler **pp_Var1;
  _xmlSAXHandler *p_Var2;
  ushort uVar3;
  int iVar4;
  xmlParserInputPtr pxVar5;
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  char *file;
  int col;
  long lStack_60;
  
  if (code == XML_ERR_NO_MEMORY) goto LAB_001421cd;
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    iVar4 = xmlVRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                           (void *)0x0,node,domain,code,level,(char *)0x0,0,(char *)str1,
                           (char *)str2,(char *)str3,int1,0,msg,ap);
    if (-1 < iVar4) {
      return;
    }
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,1,
                        (xmlError *)0x0);
    return;
  }
  if (1 < ctxt->disableSAX) {
    return;
  }
  iVar4 = xmlCtxtIsCatastrophicError(ctxt);
  if (iVar4 != 0) {
    return;
  }
  if (level == XML_ERR_WARNING) {
    if (99 < ctxt->nbWarnings) {
      return;
    }
    ctxt->nbWarnings = ctxt->nbWarnings + 1;
  }
  else {
    uVar3 = ctxt->nbErrors;
    if ((99 < uVar3) && ((level < XML_ERR_FATAL || (ctxt->wellFormed == 0)))) {
      iVar4 = xmlIsCatastrophicError(level,code);
      if (iVar4 == 0) {
        return;
      }
      uVar3 = ctxt->nbErrors;
    }
    ctxt->nbErrors = uVar3 + 1;
  }
  iVar4 = 0;
  if (((ctxt->options & 0x20U) == 0) &&
     ((level == XML_ERR_WARNING & (byte)((ctxt->options & 0x40U) >> 6)) == 0)) {
    schannel = ctxt->errorHandler;
    if (schannel == (xmlStructuredErrorFunc)0x0) {
      p_Var2 = ctxt->sax;
      if ((p_Var2->initialized == 0xdeedbeaf) &&
         (schannel = p_Var2->serror, schannel != (xmlStructuredErrorFunc)0x0)) {
        lStack_60 = 8;
        goto LAB_00142351;
      }
      if ((domain == XML_FROM_VALID) || (domain == XML_FROM_DTD)) {
        pp_Var1 = &ctxt->sax + (level == XML_ERR_WARNING);
        lStack_60 = 0xa0;
      }
      else {
        lStack_60 = 8;
        pp_Var1 = (_xmlSAXHandler **)(&p_Var2->internalSubset + (level != XML_ERR_WARNING));
      }
      channel = (xmlGenericErrorFunc)pp_Var1[0x15];
      schannel = (xmlStructuredErrorFunc)0x0;
    }
    else {
      lStack_60 = 800;
LAB_00142351:
      channel = (xmlGenericErrorFunc)0x0;
    }
    data = *(void **)((long)&ctxt->sax + lStack_60);
  }
  else {
    schannel = (xmlStructuredErrorFunc)0x0;
    channel = (xmlGenericErrorFunc)0x0;
    data = (void *)0x0;
  }
  pxVar5 = ctxt->input;
  if (pxVar5 == (xmlParserInputPtr)0x0) {
    file = (char *)0x0;
    col = 0;
  }
  else {
    file = pxVar5->filename;
    if (file == (char *)0x0) {
      if ((long)ctxt->inputNr < 2) {
        file = (char *)0x0;
      }
      else {
        pxVar5 = ctxt->inputTab[(long)ctxt->inputNr + -2];
        file = pxVar5->filename;
      }
    }
    iVar4 = pxVar5->line;
    col = pxVar5->col;
  }
  iVar4 = xmlVRaiseError(schannel,channel,data,ctxt,node,domain,code,level,file,iVar4,(char *)str1,
                         (char *)str2,(char *)str3,int1,col,msg,ap);
  if (-1 < iVar4) {
    if ((XML_ERR_WARNING < level) && (ctxt->errNo = code, level == XML_ERR_FATAL)) {
      ctxt->wellFormed = 0;
      iVar4 = xmlCtxtIsCatastrophicError(ctxt);
      if (iVar4 == 0) {
        if (ctxt->recovery == 0) {
          ctxt->disableSAX = 1;
        }
      }
      else {
        ctxt->disableSAX = 2;
      }
    }
    return;
  }
LAB_001421cd:
  xmlCtxtErrMemory(ctxt);
  return;
}

Assistant:

void
xmlCtxtVErr(xmlParserCtxtPtr ctxt, xmlNodePtr node, xmlErrorDomain domain,
            xmlParserErrors code, xmlErrorLevel level,
            const xmlChar *str1, const xmlChar *str2, const xmlChar *str3,
            int int1, const char *msg, va_list ap)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data = NULL;
    const char *file = NULL;
    int line = 0;
    int col = 0;
    int res;

    if (code == XML_ERR_NO_MEMORY) {
        xmlCtxtErrMemory(ctxt);
        return;
    }

    if (ctxt == NULL) {
        res = xmlVRaiseError(NULL, NULL, NULL, NULL, node, domain, code,
                             level, NULL, 0, (const char *) str1,
                             (const char *) str2, (const char *) str3,
                             int1, 0, msg, ap);
        if (res < 0)
            xmlRaiseMemoryError(NULL, NULL, NULL, XML_FROM_PARSER, NULL);

        return;
    }

    if (PARSER_STOPPED(ctxt))
	return;

    /* Don't overwrite catastrophic errors */
    if (xmlCtxtIsCatastrophicError(ctxt))
        return;

    if (level == XML_ERR_WARNING) {
        if (ctxt->nbWarnings >= XML_MAX_ERRORS)
            return;
        ctxt->nbWarnings += 1;
    } else {
        /* Report at least one fatal error. */
        if ((ctxt->nbErrors >= XML_MAX_ERRORS) &&
            ((level < XML_ERR_FATAL) || (ctxt->wellFormed == 0)) &&
            (!xmlIsCatastrophicError(level, code)))
            return;
        ctxt->nbErrors += 1;
    }

    if (((ctxt->options & XML_PARSE_NOERROR) == 0) &&
        ((level != XML_ERR_WARNING) ||
         ((ctxt->options & XML_PARSE_NOWARNING) == 0))) {
        if (ctxt->errorHandler) {
            schannel = ctxt->errorHandler;
            data = ctxt->errorCtxt;
        } else if ((ctxt->sax->initialized == XML_SAX2_MAGIC) &&
            (ctxt->sax->serror != NULL)) {
            schannel = ctxt->sax->serror;
            data = ctxt->userData;
        } else if ((domain == XML_FROM_VALID) || (domain == XML_FROM_DTD)) {
            if (level == XML_ERR_WARNING)
                channel = ctxt->vctxt.warning;
            else
                channel = ctxt->vctxt.error;
            data = ctxt->vctxt.userData;
        } else {
            if (level == XML_ERR_WARNING)
                channel = ctxt->sax->warning;
            else
                channel = ctxt->sax->error;
            data = ctxt->userData;
        }
    }

    if (ctxt->input != NULL) {
        xmlParserInputPtr input = ctxt->input;

        if ((input->filename == NULL) &&
            (ctxt->inputNr > 1)) {
            input = ctxt->inputTab[ctxt->inputNr - 2];
        }
        file = input->filename;
        line = input->line;
        col = input->col;
    }

    res = xmlVRaiseError(schannel, channel, data, ctxt, node, domain, code,
                         level, file, line, (const char *) str1,
                         (const char *) str2, (const char *) str3, int1, col,
                         msg, ap);

    if (res < 0) {
        xmlCtxtErrMemory(ctxt);
        return;
    }

    if (level >= XML_ERR_ERROR)
        ctxt->errNo = code;
    if (level == XML_ERR_FATAL) {
        ctxt->wellFormed = 0;

        if (xmlCtxtIsCatastrophicError(ctxt))
            ctxt->disableSAX = 2; /* stop parser */
        else if (ctxt->recovery == 0)
            ctxt->disableSAX = 1;
    }
}